

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.c
# Opt level: O2

void golf_shader_uniform_set_vec2(golf_shader_uniform_t *uniform,char *name,vec2 v)

{
  char *__s1;
  uint uVar1;
  golf_shader_uniform_member_t *pgVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  
  uVar1 = (uniform->members).length;
  uVar6 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar6;
  }
  pcVar5 = (char *)0x0;
  for (; uVar4 * 0x48 - uVar6 != 0; uVar6 = uVar6 + 0x48) {
    pgVar2 = (uniform->members).data;
    __s1 = pgVar2->name + uVar6;
    iVar3 = strcmp(__s1,name);
    if ((iVar3 == 0) && (*(int *)(pgVar2->name + uVar6 + 0x44) == 8)) {
      pcVar5 = __s1;
    }
  }
  if (pcVar5 != (char *)0x0) {
    *(vec2 *)(uniform->data + *(int *)(pcVar5 + 0x40)) = v;
    return;
  }
  golf_log_warning("Unable to find vec2 member: %s",name);
  return;
}

Assistant:

void golf_shader_uniform_set_vec2(golf_shader_uniform_t *uniform, const char *name, vec2 v) {
    golf_shader_uniform_member_t *member = NULL;
    for (int i = 0; i < uniform->members.length; i++) {
        if ((strcmp(uniform->members.data[i].name, name) == 0) && uniform->members.data[i].size == 8) {
            member = &uniform->members.data[i];
        }
    }
    if (!member) {
        golf_log_warning("Unable to find vec2 member: %s", name);
        return;
    }
    memcpy(uniform->data + member->offset, &v, 8);
}